

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

ll_elem * deref(elem_ptr_t *ptr)

{
  ll_elem *e_00;
  ll_elem *plVar1;
  ulong uVar2;
  bool bVar3;
  ulong local_68;
  ll_elem *local_48;
  uintptr_t old;
  uintptr_t e;
  elem_ptr_t *ptr_local;
  
  do {
    local_48 = (ll_elem *)*ptr;
    do {
      LOCK();
      e_00 = (ll_elem *)*ptr;
      bVar3 = local_48 == e_00;
      if (bVar3) {
        *ptr = (ulong)local_48 | 1;
        e_00 = local_48;
      }
      UNLOCK();
      local_48 = e_00;
    } while (!bVar3);
  } while (((ulong)e_00 & 1) != 0);
  plVar1 = ptr_clear(e_00);
  if (plVar1 != (ll_elem *)0x0) {
    deref_acquire(e_00,1);
  }
  local_68 = *ptr;
  do {
    LOCK();
    uVar2 = *ptr;
    bVar3 = local_68 == uVar2;
    if (bVar3) {
      *ptr = local_68 & 0xfffffffffffffffe;
      uVar2 = local_68;
    }
    UNLOCK();
    local_68 = uVar2;
  } while (!bVar3);
  if ((uVar2 & 1) == 0) {
    __assert_fail("old & DEREF",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0xb0,
                  "struct ll_elem *deref(elem_ptr_t *)");
  }
  return e_00;
}

Assistant:

static __inline struct ll_elem*
deref(elem_ptr_t *ptr)
{
	uintptr_t e, old;

	while ((e = atomic_fetch_or_explicit(ptr, DEREF,
	    memory_order_consume)) & DEREF)
		SPINWAIT();
	if (ptr_clear((struct ll_elem*)e) != NULL)
		deref_acquire((struct ll_elem*)e, 1);
	old = atomic_fetch_and_explicit(ptr, ~DEREF, memory_order_release);
	assert(old & DEREF);
	return (struct ll_elem*)e;
}